

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,DryHandler *handler)

{
  byte *pbVar1;
  byte bVar2;
  Ch *pCVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  byte *pbVar7;
  byte *pbVar8;
  Ch *pCVar9;
  byte *pbVar10;
  long lVar11;
  byte bVar12;
  byte bVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  bool bVar22;
  double dVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar26 [16];
  undefined1 in_ZMM3 [64];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  
  bVar13 = *is->src_;
  if (bVar13 < 0x6e) {
    if (bVar13 == 0x22) {
      ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
                (this,is,handler,false);
      return;
    }
    if (bVar13 == 0x5b) {
      if (*is->src_ != '[') {
        __assert_fail("is.Peek() == \'[\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                      ,0x327,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                     );
      }
      pbVar8 = is->src_ + 1;
      is->src_ = pbVar8;
      while (((ulong)*pbVar8 < 0x21 && ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0))) {
        pbVar8 = pbVar8 + 1;
      }
      is->src_ = pbVar8;
      if (*(int *)(this + 0x30) == 0) {
        if (*pbVar8 == 0x5d) {
          is->src_ = pbVar8 + 1;
        }
        else {
          ParseArray<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>();
        }
      }
      return;
    }
    if (bVar13 != 0x66) {
      ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
                (this,is,handler);
      return;
    }
    pCVar3 = is->src_;
    if (*pCVar3 == 'f') {
      pCVar9 = pCVar3 + 1;
      is->src_ = pCVar9;
      if (pCVar3[1] == 'a') {
        pCVar9 = pCVar3 + 2;
        is->src_ = pCVar9;
        if (pCVar3[2] == 'l') {
          pCVar9 = pCVar3 + 3;
          is->src_ = pCVar9;
          if (pCVar3[3] == 's') {
            pCVar9 = pCVar3 + 4;
            is->src_ = pCVar9;
            if (pCVar3[4] == 'e') {
              is->src_ = pCVar3 + 5;
              return;
            }
          }
        }
      }
      if (*(int *)(this + 0x30) == 0) {
        pCVar3 = is->head_;
        *(undefined4 *)(this + 0x30) = 3;
        *(long *)(this + 0x38) = (long)pCVar9 - (long)pCVar3;
        return;
      }
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x379,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                   );
    }
    __assert_fail("is.Peek() == \'f\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x371,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                 );
  }
  if (bVar13 == 0x7b) {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x2e3,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                   );
    }
    pbVar8 = is->src_ + 1;
    is->src_ = pbVar8;
    while (((ulong)*pbVar8 < 0x21 && ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0))) {
      pbVar8 = pbVar8 + 1;
    }
    is->src_ = pbVar8;
    if (*(int *)(this + 0x30) == 0) {
      bVar13 = *pbVar8;
      if (bVar13 == 0x7d) {
LAB_00101f0f:
        is->src_ = pbVar8 + 1;
      }
      else {
        while (bVar13 == 0x22) {
          ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
                    (this,is,handler,true);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pbVar8 = is->src_;
          pbVar10 = pbVar8;
          while (((ulong)*pbVar8 < 0x21 && ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0))) {
            pbVar8 = pbVar8 + 1;
            pbVar10 = pbVar10 + 1;
          }
          is->src_ = pbVar8;
          if (*pbVar8 != 0x3a) {
            lVar11 = (long)pbVar10 - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 5;
LAB_0010201b:
            *(long *)(this + 0x38) = lVar11;
            return;
          }
          pbVar8 = pbVar8 + 1;
          is->src_ = pbVar8;
          while (((ulong)*pbVar8 < 0x21 && ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0))) {
            pbVar8 = pbVar8 + 1;
          }
          is->src_ = pbVar8;
          ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pbVar8 = is->src_;
          pbVar10 = pbVar8;
          while (((ulong)*pbVar8 < 0x21 && ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0))) {
            pbVar8 = pbVar8 + 1;
            pbVar10 = pbVar10 + 1;
          }
          is->src_ = pbVar8;
          if (*pbVar8 != 0x2c) {
            if (*pbVar8 != 0x7d) {
              lVar11 = (long)pbVar10 - (long)is->head_;
              *(undefined4 *)(this + 0x30) = 6;
              goto LAB_0010201b;
            }
            goto LAB_00101f0f;
          }
          pbVar8 = pbVar8 + 1;
          is->src_ = pbVar8;
          while (((ulong)*pbVar8 < 0x21 && ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0))) {
            pbVar8 = pbVar8 + 1;
          }
          is->src_ = pbVar8;
          bVar13 = *pbVar8;
        }
        pCVar3 = is->head_;
        *(undefined4 *)(this + 0x30) = 4;
        *(long *)(this + 0x38) = (long)pbVar8 - (long)pCVar3;
      }
    }
    return;
  }
  if (bVar13 == 0x74) {
    pCVar3 = is->src_;
    if (*pCVar3 != 't') {
      __assert_fail("is.Peek() == \'t\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x364,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                   );
    }
    pCVar9 = pCVar3 + 1;
    is->src_ = pCVar9;
    if (pCVar3[1] == 'r') {
      pCVar9 = pCVar3 + 2;
      is->src_ = pCVar9;
      if (pCVar3[2] == 'u') {
        pCVar9 = pCVar3 + 3;
        is->src_ = pCVar9;
        if (pCVar3[3] == 'e') {
          is->src_ = pCVar3 + 4;
          return;
        }
      }
    }
    if (*(int *)(this + 0x30) == 0) {
      pCVar3 = is->head_;
      *(undefined4 *)(this + 0x30) = 3;
      *(long *)(this + 0x38) = (long)pCVar9 - (long)pCVar3;
      return;
    }
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x36c,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                 );
  }
  if (bVar13 == 0x6e) {
    ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>(this,is,handler);
    return;
  }
  pbVar10 = is->src_;
  bVar13 = *pbVar10;
  pbVar8 = pbVar10;
  bVar12 = bVar13;
  if (bVar13 == 0x2d) {
    bVar12 = pbVar10[1];
    pbVar8 = pbVar10 + 1;
  }
  pCVar3 = is->head_;
  if (bVar12 == 0x30) {
    uVar20 = (uint)pbVar8[1];
    pbVar7 = pbVar8 + 1;
    auVar24 = ZEXT1664(ZEXT816(0));
    bVar5 = false;
    uVar18 = 0;
    bVar6 = false;
    iVar14 = 0;
    bVar22 = false;
    uVar16 = 0;
    goto LAB_00101341;
  }
  if ((byte)(bVar12 - 0x31) < 9) {
    bVar2 = pbVar8[1];
    uVar15 = (ulong)bVar2;
    pbVar7 = pbVar8 + 1;
    auVar24 = ZEXT1664(ZEXT816(0));
    uVar16 = bVar12 - 0x30;
    if (bVar13 == 0x2d) {
      if ((byte)(bVar2 - 0x30) < 10) {
        iVar14 = 0;
LAB_001011c5:
        if (uVar16 < 0xccccccc) {
LAB_001011ce:
          iVar14 = iVar14 + 1;
          uVar16 = uVar16 * 10 + -0x30 + (int)uVar15;
          bVar2 = pbVar7[1];
          uVar15 = (ulong)bVar2;
          pbVar7 = pbVar7 + 1;
          if (9 < (byte)(bVar2 - 0x30)) goto LAB_001012a9;
          goto LAB_001011c5;
        }
        if (uVar16 != 0xccccccc) goto LAB_0010124a;
        if ((byte)uVar15 < 0x39) goto LAB_001011ce;
        uVar16 = 0xccccccc;
        uVar15 = 0x39;
LAB_0010124a:
        uVar18 = (ulong)uVar16;
        if (bVar13 == 0x2d) {
          do {
            if ((0xccccccccccccccb < uVar18) && (0x38 < (byte)uVar15 || uVar18 != 0xccccccccccccccc)
               ) goto LAB_001012fc;
            iVar14 = iVar14 + 1;
            uVar17 = uVar15 & 0xf;
            bVar13 = pbVar7[1];
            uVar15 = (ulong)bVar13;
            pbVar7 = pbVar7 + 1;
            uVar18 = uVar17 + uVar18 * 10;
          } while ((byte)(bVar13 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < uVar18) &&
               (0x35 < (byte)uVar15 || uVar18 != 0x1999999999999999)) goto LAB_001012fc;
            iVar14 = iVar14 + 1;
            uVar17 = uVar15 & 0xf;
            bVar13 = pbVar7[1];
            uVar15 = (ulong)bVar13;
            pbVar7 = pbVar7 + 1;
            uVar18 = uVar17 + uVar18 * 10;
          } while ((byte)(bVar13 - 0x30) < 10);
        }
        uVar20 = (uint)bVar13;
        auVar24 = ZEXT1664(ZEXT816(0));
        bVar22 = true;
        bVar5 = false;
        bVar6 = false;
        goto LAB_00101341;
      }
LAB_00101678:
      iVar14 = 0;
    }
    else {
      if (9 < (byte)(bVar2 - 0x30)) goto LAB_00101678;
      iVar14 = 0;
      do {
        if (0x19999998 < uVar16) {
          if (uVar16 != 0x19999999) goto LAB_0010124a;
          if (0x35 < (byte)uVar15) {
            uVar16 = 0x19999999;
            goto LAB_0010124a;
          }
        }
        iVar14 = iVar14 + 1;
        uVar16 = uVar16 * 10 + -0x30 + (int)uVar15;
        bVar2 = pbVar7[1];
        uVar15 = (ulong)bVar2;
        pbVar7 = pbVar7 + 1;
      } while ((byte)(bVar2 - 0x30) < 10);
    }
LAB_001012a9:
    uVar20 = (uint)bVar2;
    uVar18 = 0;
    bVar6 = false;
    bVar5 = false;
    bVar22 = false;
    goto LAB_00101341;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x5fc,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                 );
  }
  *(undefined4 *)(this + 0x30) = 3;
  pbVar7 = pbVar8;
LAB_0010165f:
  *(long *)(this + 0x38) = (long)pbVar8 - (long)pCVar3;
LAB_00101666:
  is->src_ = pbVar7;
  return;
LAB_001012fc:
  auVar25 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,uVar18);
  auVar24 = ZEXT1664(auVar25);
  do {
    auVar25._0_8_ = (double)((int)uVar15 + -0x30);
    auVar25._8_8_ = in_ZMM3._8_8_;
    bVar13 = pbVar7[1];
    uVar15 = (ulong)bVar13;
    uVar20 = (uint)bVar13;
    pbVar7 = pbVar7 + 1;
    auVar25 = vfmadd132sd_fma(auVar24._0_16_,auVar25,ZEXT816(0x4024000000000000));
    auVar24 = ZEXT1664(auVar25);
  } while ((byte)(bVar13 - 0x30) < 10);
  bVar5 = true;
  bVar6 = true;
  bVar22 = true;
LAB_00101341:
  dVar23 = auVar24._0_8_;
  iVar19 = 0;
  if ((char)uVar20 != '.') {
    iVar21 = 0;
LAB_0010146c:
    bVar5 = bVar6;
    if ((uVar20 | 0x20) != 0x65) goto LAB_001015d7;
    uVar15 = (ulong)uVar16;
    if (bVar22) {
      uVar15 = uVar18;
    }
    bVar5 = true;
    if (bVar6) {
      bVar5 = bVar6;
    }
    bVar13 = pbVar7[1];
    bVar22 = bVar13 != 0x2b;
    if ((bVar22) && (bVar13 != 0x2d)) {
      if (9 < (byte)(bVar13 - 0x30)) {
        pbVar8 = pbVar7 + 1;
LAB_00101527:
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                        ,0x67c,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xf;
        pbVar7 = pbVar8;
        goto LAB_0010165f;
      }
      iVar14 = bVar13 - 0x30;
      pbVar7 = pbVar7 + 2;
    }
    else {
      pbVar8 = pbVar7 + 2;
      if (9 < (byte)(*pbVar8 - 0x30)) {
        pbVar8 = pbVar7 + 2;
        goto LAB_00101527;
      }
      pbVar7 = pbVar7 + 3;
      iVar14 = *pbVar8 - 0x30;
      if (bVar13 != 0x2b) {
        if (0 < iVar21) {
          __assert_fail("expFrac <= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                        ,0x667,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                       );
        }
        bVar13 = *pbVar7;
        if ((byte)(bVar13 - 0x30) < 10) {
          do {
            iVar14 = iVar14 * 10 + -0x30 + (uint)bVar13;
            if ((iVar21 + 0x7ffffff7) / 10 < iVar14) goto LAB_00101510;
            pbVar7 = pbVar7 + 1;
            bVar13 = *pbVar7;
          } while ((byte)(bVar13 - 0x30) < 10);
        }
        else {
          bVar22 = true;
        }
        goto LAB_001015b3;
      }
    }
    do {
      bVar13 = *pbVar7;
      if (9 < (byte)(bVar13 - 0x30)) {
        bVar22 = false;
        goto LAB_001015b3;
      }
      pbVar7 = pbVar7 + 1;
      iVar14 = iVar14 * 10 + -0x30 + (uint)bVar13;
    } while (iVar14 <= 0x134 - iVar21);
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x677,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                   );
    }
    goto LAB_00101655;
  }
  uVar20 = (uint)pbVar7[1];
  pbVar8 = pbVar7 + 1;
  if (0xf5 < (byte)(pbVar7[1] - 0x3a)) {
    iVar21 = 0;
    if (bVar5) {
LAB_001013c9:
      do {
        dVar23 = auVar24._0_8_;
        pbVar7 = pbVar8;
        if (0x39 < (byte)uVar20) goto LAB_0010146c;
        if (iVar14 < 0x11) {
          iVar21 = iVar21 + -1;
          auVar26._0_8_ = (double)(int)(uVar20 - 0x30);
          auVar26._8_8_ = in_XMM4_Qb;
          auVar25 = vfmadd231sd_fma(auVar26,auVar24._0_16_,ZEXT816(0x4024000000000000));
          if (0.0 < auVar25._0_8_) {
            iVar14 = iVar14 + 1;
          }
          auVar24 = ZEXT1664(auVar25);
        }
        dVar23 = auVar24._0_8_;
        pbVar7 = pbVar8 + 1;
        uVar20 = (uint)*pbVar7;
        pbVar8 = pbVar8 + 1;
      } while (0x2f < *pbVar7);
      iVar19 = 0;
      pbVar7 = pbVar8;
      bVar5 = bVar6;
      goto LAB_001015d7;
    }
    if (!bVar22) {
      uVar18 = (ulong)uVar16;
    }
    iVar21 = 0;
    do {
      if ((0x39 < (byte)uVar20) || (uVar18 >> 0x35 != 0)) {
        auVar25 = vcvtusi2sd_avx512f(in_ZMM3._0_16_,uVar18);
        auVar24 = ZEXT1664(auVar25);
        bVar6 = true;
        goto LAB_001013c9;
      }
      iVar21 = iVar21 + -1;
      pbVar7 = pbVar8 + 1;
      uVar18 = (ulong)(uVar20 - 0x30) + uVar18 * 10;
      iVar14 = iVar14 + (uint)(uVar18 != 0);
      pbVar1 = pbVar8 + 1;
      uVar20 = (uint)*pbVar1;
      pbVar8 = pbVar7;
    } while (0x2f < *pbVar1);
    dVar23 = (double)(long)uVar18;
    iVar19 = 0;
    goto LAB_001015df;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x627,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                 );
  }
  *(undefined4 *)(this + 0x30) = 0xe;
  pbVar7 = pbVar8;
  goto LAB_0010165f;
LAB_00101510:
  do {
    pbVar8 = pbVar7 + 1;
    pbVar7 = pbVar7 + 1;
  } while ((byte)(*pbVar8 - 0x30) < 10);
LAB_001015b3:
  auVar4._8_8_ = in_XMM4_Qb;
  auVar4._0_8_ = in_XMM4_Qa;
  auVar25 = vcvtusi2sd_avx512f(auVar4,uVar15);
  iVar19 = -iVar14;
  if (!bVar22) {
    iVar19 = iVar14;
  }
  dVar23 = (double)((ulong)bVar6 * (long)dVar23 + (ulong)!bVar6 * auVar25._0_8_);
LAB_001015d7:
  if (bVar5 == false) goto LAB_00101666;
LAB_001015df:
  uVar20 = iVar19 + iVar21;
  if ((int)uVar20 < -0x134) {
    if (uVar20 < 0xfffffd98) goto LAB_00101666;
    dVar23 = (dVar23 / 1e+308) / *(double *)(internal::Pow10(int)::e + (ulong)(-uVar20 - 0x134) * 8)
    ;
  }
  else if ((int)uVar20 < 0) {
    dVar23 = dVar23 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar20 * 8);
  }
  else {
    if (0x134 < uVar20) {
      __assert_fail("n >= 0 && n <= 308",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/internal/pow10.h"
                    ,0x30,"double rapidjson::internal::Pow10(int)");
    }
    dVar23 = dVar23 * *(double *)(internal::Pow10(int)::e + (ulong)uVar20 * 8);
  }
  if (dVar23 <= 1.79769313486232e+308) goto LAB_00101666;
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x6ab,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                 );
  }
LAB_00101655:
  *(undefined4 *)(this + 0x30) = 0xd;
  pbVar8 = pbVar10;
  goto LAB_0010165f;
}

Assistant:

Ch Peek() const { return *src_; }